

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_shape(void)

{
  player_shape *ppVar1;
  player_blow *ppVar2;
  player_shape *p;
  player_blow *p_00;
  
  p = shapes;
  while (p != (player_shape *)0x0) {
    p_00 = p->blows;
    ppVar1 = p->next;
    string_free(p->name);
    free_effect(p->effect);
    if (p->breath_name != (char *)0x0) {
      string_free(p->breath_name);
    }
    while (p_00 != (player_blow *)0x0) {
      ppVar2 = p_00->next;
      string_free(p_00->name);
      mem_free(p_00);
      p_00 = ppVar2;
    }
    mem_free(p);
    p = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_shape(void)
{
	struct player_shape *shape = shapes;
	struct player_shape *next;

	while (shape) {
		struct player_blow *blow = shape->blows;
		next = shape->next;
		string_free((char *)shape->name);
		free_effect(shape->effect);
		if (shape->breath_name) {
			string_free((char *)shape->breath_name);
		}
		while (blow) {
			struct player_blow *next_blow = blow->next;
			string_free(blow->name);
			mem_free(blow);
			blow = next_blow;
		}
		mem_free(shape);
		shape = next;
	}
}